

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int closePendingFds(unixFile *pFile)

{
  unixInodeInfo *puVar1;
  UnixUnusedFd *pUVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  UnixUnusedFd *pUVar6;
  UnixUnusedFd *p;
  
  puVar1 = pFile->pInode;
  iVar5 = 0;
  pUVar6 = (UnixUnusedFd *)0x0;
  p = puVar1->pUnused;
  while (p != (UnixUnusedFd *)0x0) {
    pUVar2 = p->pNext;
    iVar3 = close(p->fd);
    if (iVar3 == 0) {
      unqlite_free(p);
      p = pUVar2;
    }
    else {
      piVar4 = __errno_location();
      pFile->lastErrno = *piVar4;
      p->pNext = pUVar6;
      iVar5 = -2;
      pUVar6 = p;
      p = pUVar2;
    }
  }
  puVar1->pUnused = pUVar6;
  return iVar5;
}

Assistant:

static int closePendingFds(unixFile *pFile){
  int rc = UNQLITE_OK;
  unixInodeInfo *pInode = pFile->pInode;
  UnixUnusedFd *pError = 0;
  UnixUnusedFd *p;
  UnixUnusedFd *pNext;
  for(p=pInode->pUnused; p; p=pNext){
    pNext = p->pNext;
    if( close(p->fd) ){
      pFile->lastErrno = errno;
	  rc = UNQLITE_IOERR;
      p->pNext = pError;
      pError = p;
    }else{
      unqlite_free(p);
    }
  }
  pInode->pUnused = pError;
  return rc;
}